

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

EmptyPortConnectionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EmptyPortConnectionSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1)

{
  Token placeholder;
  EmptyPortConnectionSyntax *this_00;
  
  this_00 = (EmptyPortConnectionSyntax *)allocate(this,0x60,8);
  placeholder.kind = args_1->kind;
  placeholder._2_1_ = args_1->field_0x2;
  placeholder.numFlags.raw = (args_1->numFlags).raw;
  placeholder.rawLen = args_1->rawLen;
  placeholder.info = args_1->info;
  slang::syntax::EmptyPortConnectionSyntax::EmptyPortConnectionSyntax(this_00,args,placeholder);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }